

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u16 cellSizePtrTableLeaf(MemPage *pPage,u8 *pCell)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  u8 *pIter;
  
  iVar9 = (int)pCell;
  bVar1 = *pCell;
  uVar8 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar8 = bVar1 & 0x7f;
    uVar6 = 0;
    do {
      lVar3 = uVar6 + 1;
      uVar7 = uVar6 + 1;
      uVar8 = pCell[lVar3] & 0x7f | uVar8 << 7;
      if (6 < uVar6) break;
      uVar6 = uVar7;
    } while ((char)pCell[lVar3] < '\0');
    pCell = pCell + uVar7;
  }
  iVar4 = (int)pCell;
  if ((char)pCell[1] < '\0') {
    if ((char)pCell[2] < '\0') {
      if ((char)pCell[3] < '\0') {
        if ((char)pCell[4] < '\0') {
          if ((char)pCell[5] < '\0') {
            if ((char)pCell[6] < '\0') {
              if ((char)pCell[7] < '\0') {
                iVar4 = iVar4 + (uint)(pCell[8] >> 7) + 9;
              }
              else {
                iVar4 = iVar4 + 8;
              }
            }
            else {
              iVar4 = iVar4 + 7;
            }
          }
          else {
            iVar4 = iVar4 + 6;
          }
        }
        else {
          iVar4 = iVar4 + 5;
        }
      }
      else {
        iVar4 = iVar4 + 4;
      }
    }
    else {
      iVar4 = iVar4 + 3;
    }
  }
  else {
    iVar4 = iVar4 + 2;
  }
  if (pPage->maxLocal < uVar8) {
    uVar2 = pPage->minLocal;
    uVar8 = (uVar8 - uVar2) % (pPage->pBt->usableSize - 4) + (uint)uVar2;
    if (pPage->maxLocal < uVar8) {
      uVar8 = (uint)uVar2;
    }
    uVar5 = (iVar4 - iVar9) + uVar8 + 4;
  }
  else {
    uVar8 = uVar8 + (iVar4 - iVar9);
    uVar5 = 4;
    if (4 < uVar8) {
      uVar5 = uVar8;
    }
  }
  return (u16)uVar5;
}

Assistant:

static u16 cellSizePtrTableLeaf(MemPage *pPage, u8 *pCell){
  u8 *pIter = pCell;   /* For looping over bytes of pCell */
  u8 *pEnd;            /* End mark for a varint */
  u32 nSize;           /* Size value to return */

#ifdef SQLITE_DEBUG
  /* The value returned by this function should always be the same as
  ** the (CellInfo.nSize) value found by doing a full parse of the
  ** cell. If SQLITE_DEBUG is defined, an assert() at the bottom of
  ** this function verifies that this invariant is not violated. */
  CellInfo debuginfo;
  pPage->xParseCell(pPage, pCell, &debuginfo);
#endif

  nSize = *pIter;
  if( nSize>=0x80 ){
    pEnd = &pIter[8];
    nSize &= 0x7f;
    do{
      nSize = (nSize<<7) | (*++pIter & 0x7f);
    }while( *(pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;
  /* pIter now points at the 64-bit integer key value, a variable length
  ** integer. The following block moves pIter to point at the first byte
  ** past the end of the key value. */
  if( (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80 ){ pIter++; }
  testcase( nSize==pPage->maxLocal );
  testcase( nSize==(u32)pPage->maxLocal+1 );
  if( nSize<=pPage->maxLocal ){
    nSize += (u32)(pIter - pCell);
    if( nSize<4 ) nSize = 4;
  }else{
    int minLocal = pPage->minLocal;
    nSize = minLocal + (nSize - minLocal) % (pPage->pBt->usableSize - 4);
    testcase( nSize==pPage->maxLocal );
    testcase( nSize==(u32)pPage->maxLocal+1 );
    if( nSize>pPage->maxLocal ){
      nSize = minLocal;
    }
    nSize += 4 + (u16)(pIter - pCell);
  }
  assert( nSize==debuginfo.nSize || CORRUPT_DB );
  return (u16)nSize;
}